

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall
FNodeBuilder::FVertexMap::FVertexMap
          (FVertexMap *this,FNodeBuilder *builder,fixed_t minx,fixed_t miny,fixed_t maxx,
          fixed_t maxy)

{
  long *plVar1;
  ulong uVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  
  (this->super_IVertexMap)._vptr_IVertexMap = (_func_int **)&PTR__FVertexMap_006f6f58;
  this->MyBuilder = builder;
  this->MinX = minx;
  iVar3 = (int)((((double)maxx - (double)minx) + 1.0 + 16777215.0) * 5.9604644775390625e-08);
  iVar4 = (int)((((double)maxy - (double)miny) + 1.0 + 16777215.0) * 5.9604644775390625e-08);
  this->MinY = miny;
  this->MaxX = minx + -1 + iVar3 * 0x1000000;
  this->MaxY = miny + -1 + iVar4 * 0x1000000;
  this->BlocksWide = iVar3;
  this->BlocksTall = iVar4;
  iVar4 = iVar4 * iVar3;
  __n = (long)iVar4 * 0x10;
  uVar2 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar2 = __n + 8;
  }
  plVar1 = (long *)operator_new__(uVar2);
  *plVar1 = (long)iVar4;
  if (iVar4 != 0) {
    memset((TArray<int,_int> *)(plVar1 + 1),0,__n);
  }
  this->VertexGrid = (TArray<int,_int> *)(plVar1 + 1);
  return;
}

Assistant:

FNodeBuilder::FVertexMap::FVertexMap (FNodeBuilder &builder,
	fixed_t minx, fixed_t miny, fixed_t maxx, fixed_t maxy)
	: MyBuilder(builder)
{
	MinX = minx;
	MinY = miny;
	BlocksWide = int(((double(maxx) - minx + 1) + (BLOCK_SIZE - 1)) / BLOCK_SIZE);
	BlocksTall = int(((double(maxy) - miny + 1) + (BLOCK_SIZE - 1)) / BLOCK_SIZE);
	MaxX = MinX + BlocksWide * BLOCK_SIZE - 1;
	MaxY = MinY + BlocksTall * BLOCK_SIZE - 1;
	VertexGrid = new TArray<int>[BlocksWide * BlocksTall];
}